

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_rope(ggml_context *ctx,ggml_tensor *a,int n_past,int n_dims,int mode)

{
  int *piVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *extraout_RAX;
  undefined4 in_register_0000000c;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *unaff_RBX;
  undefined4 in_register_00000084;
  ggml_tensor *in_R9;
  ggml_tensor *unaff_R14;
  int iStack_88;
  int iStack_84;
  undefined8 uStack_80;
  ggml_tensor *pgStack_70;
  ggml_tensor *pgStack_68;
  int iStack_60;
  int iStack_5c;
  undefined8 uStack_58;
  ggml_tensor *pgStack_48;
  int local_34;
  
  pgVar3 = (ggml_tensor *)CONCAT44(in_register_00000084,mode);
  pgVar2 = (ggml_tensor *)CONCAT44(in_register_0000000c,n_dims);
  if (n_past < 0) {
    ggml_rope_cold_1();
  }
  else {
    unaff_RBX = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&local_34,(void *)0x0);
      piVar1 = (int *)pgVar3->data;
      *piVar1 = n_past;
      piVar1[1] = n_dims;
      piVar1[2] = mode;
      pgVar2->op = GGML_OP_ROPE;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = pgVar3;
      return pgVar2;
    }
  }
  ggml_rope_cold_2();
  pgVar4 = unaff_RBX;
  pgStack_48 = unaff_RBX;
  if ((extraout_RDX->ne[2] == 1) && (pgVar4 = extraout_RDX, extraout_RDX->ne[3] == 1)) {
    unaff_R14 = a;
    if (a->ne[1] != extraout_RDX->ne[1]) goto LAB_001260bf;
    if (a->ne[3] == 1) {
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
        iStack_60 = extraout_RDX->ne[0];
        iStack_5c = a->ne[2];
        uStack_58 = 0x100000001;
        pgStack_68 = (ggml_tensor *)0x126096;
        pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_60,(void *)0x0);
        pgVar2->op = GGML_OP_CONV_1D_1S;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX;
        return pgVar2;
      }
      goto LAB_001260ba;
    }
  }
  else {
    pgStack_68 = (ggml_tensor *)0x1260ba;
    ggml_conv_1d_1s_cold_1();
LAB_001260ba:
    pgStack_68 = (ggml_tensor *)0x1260bf;
    ggml_conv_1d_1s_cold_4();
LAB_001260bf:
    pgStack_68 = (ggml_tensor *)0x1260c4;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_68 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_70 = pgVar4;
  pgStack_68 = unaff_R14;
  if ((extraout_RDX_00->ne[2] == 1) && (extraout_RDX_00->ne[3] == 1)) {
    if (a->ne[1] == extraout_RDX_00->ne[1]) {
      if (a->ne[3] != 1) goto LAB_00126169;
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        iStack_88 = extraout_RDX_00->ne[0] / 2;
        iStack_84 = a->ne[2];
        uStack_80 = 0x100000001;
        pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_88,(void *)0x0);
        pgVar2->op = GGML_OP_CONV_1D_2S;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX_00;
        return pgVar2;
      }
      goto LAB_0012615f;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_0012615f:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_00126169:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_01->ne[0] == a->ne[0]) && (extraout_RDX_01->ne[2] == a->ne[2])) &&
     (extraout_RDX_01->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) &&
       (pgVar2->grad == (ggml_tensor *)0x0)) {
      pgVar4 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar4->op = GGML_OP_FLASH_ATTN;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = a;
      pgVar4->src1 = extraout_RDX_01;
      pgVar4->opt[0] = pgVar2;
      pgVar2 = ggml_new_i32(ctx,(uint)pgVar3 & 0xff);
      pgVar4->opt[1] = pgVar2;
      return pgVar4;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_02->ne[0] == a->ne[0]) && (extraout_RDX_02->ne[2] == a->ne[2])) &&
     (extraout_RDX_02->ne[3] == a->ne[3])) {
    if ((((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
        (pgVar2->grad == (ggml_tensor *)0x0)) &&
       ((pgVar3->grad == (ggml_tensor *)0x0 && (in_R9->grad == (ggml_tensor *)0x0)))) {
      pgVar4 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar4->op = GGML_OP_FLASH_FF;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = a;
      pgVar4->src1 = extraout_RDX_02;
      pgVar4->opt[0] = pgVar2;
      pgVar4->opt[1] = pgVar3;
      pgVar4->opt[2] = in_R9;
      return pgVar4;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar2;
    return pgVar2;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_rope(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past,
        int                   n_dims,
        int                   mode) {
    GGML_ASSERT(n_past >= 0);
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: when implement backward, fix this:
    //struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    struct ggml_tensor * b = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, 3);
    ((int32_t *) b->data)[0] = n_past;
    ((int32_t *) b->data)[1] = n_dims;
    ((int32_t *) b->data)[2] = mode;

    result->op   = GGML_OP_ROPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}